

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O2

void __thiscall lr_grammar::GrammarLR::GrammarLR(GrammarLR *this,string *generate,int length)

{
  _Rb_tree_header *p_Var1;
  vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_> *pvVar2;
  vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_> *pvVar3;
  int iVar4;
  int iVar5;
  pointer pbVar6;
  pointer pvVar7;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar8;
  ostream *poVar9;
  long lVar10;
  int *piVar11;
  pointer pEVar12;
  pointer pDVar13;
  pointer pvVar14;
  int m;
  ulong uVar15;
  ulong uVar16;
  int j_1;
  char *pcVar17;
  int j_2;
  int j;
  ulong uVar18;
  ulong uVar19;
  int i;
  long lVar20;
  bool bVar21;
  string t;
  string name;
  string text;
  string finnalyC;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result_of_name;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vectorGenrates;
  char buffer [8];
  vector<int,_std::allocator<int>_> exp;
  _Vector_base<int,_std::allocator<int>_> local_1a0;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  _Vector_base<int,_std::allocator<int>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pvVar2 = &this->elements;
  pvVar3 = &this->states;
  uVar16 = 0;
  memset(&(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,200);
  vectorGenrates.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < length) {
    uVar16 = (ulong)(uint)length;
  }
  vectorGenrates.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vectorGenrates.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar18 = uVar16;
  while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
    name._M_dataplus._M_p = (pointer)0x0;
    name._M_string_length = 0;
    name.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&local_70,(string *)generate);
    public_tool::parse_productions
              (&local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&name);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&vectorGenrates,(value_type *)&name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name);
    generate = generate + 1;
  }
  for (lVar20 = 0; uVar16 * 0x18 - lVar20 != 0; lVar20 = lVar20 + 0x18) {
    std::__cxx11::string::string
              ((string *)&local_90,
               *(string **)
                ((long)&((vectorGenrates.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar20));
    add_elem(this,&local_90,false);
    std::__cxx11::string::~string((string *)&local_90);
  }
  result_of_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result_of_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result_of_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar18 = 0; uVar18 != uVar16; uVar18 = uVar18 + 1) {
    uVar19 = 1;
    while( true ) {
      pbVar6 = vectorGenrates.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)vectorGenrates.
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar18].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5) <= uVar19)
      break;
      std::__cxx11::string::string((string *)&local_108,(string *)(pbVar6 + uVar19));
      public_tool::parse_elem(&local_108,&result_of_name);
      std::__cxx11::string::~string((string *)&local_108);
      name.field_2._M_allocated_capacity = 0;
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      lVar20 = 0;
      for (uVar15 = 0;
          uVar15 < (ulong)((long)result_of_name.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)result_of_name.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar15 = uVar15 + 1) {
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   (string *)
                   ((long)&((result_of_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar20)
                  );
        iVar8 = find_name(this,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        finnalyC._M_dataplus._M_p._0_4_ = iVar8;
        if (iVar8 == -2) {
          std::__cxx11::string::string
                    ((string *)&local_d0,
                     (string *)
                     ((long)&((result_of_name.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar20));
          finnalyC._M_dataplus._M_p._0_4_ = add_elem(this,&local_d0,true);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&name,(value_type_conflict *)&finnalyC);
        lVar20 = lVar20 + 0x20;
      }
      std::__cxx11::string::string
                ((string *)&local_128,
                 (string *)
                 vectorGenrates.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar8 = find_name(this,&local_128);
      pEVar12 = (pvVar2->
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>).
                _M_impl.super__Vector_impl_data._M_start;
      base_grammar::Express::Express
                ((Express *)&local_e8,(vector<int,_std::allocator<int>_> *)&name);
      std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
                (&pEVar12[iVar8].expression_of_set,(value_type *)&local_e8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e8);
      std::__cxx11::string::~string((string *)&local_128);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&name);
      uVar19 = uVar19 + 1;
    }
  }
  std::__cxx11::string::string((string *)&local_148,"#",(allocator *)&name);
  add_elem(this,&local_148,true);
  std::__cxx11::string::~string((string *)&local_148);
  std::operator+(&name,&(((pvVar2->
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          )._M_impl.super__Vector_impl_data._M_start)->super_Elem).name,"\'");
  std::__cxx11::string::string((string *)&local_168,(string *)&name);
  iVar8 = add_elem(this,&local_168,false);
  std::__cxx11::string::~string((string *)&local_168);
  exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  exp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  finnalyC._M_dataplus._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&exp,(int *)&finnalyC);
  pEVar12 = (pvVar2->
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>).
            _M_impl.super__Vector_impl_data._M_start;
  base_grammar::Express::Express((Express *)&local_1a0,&exp);
  std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
            (&pEVar12[iVar8].expression_of_set,(value_type *)&local_1a0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1a0);
  std::__cxx11::string::string((string *)&finnalyC,"finnaly:",(allocator *)&text);
  uVar16 = 0;
  while( true ) {
    pEVar12 = (this->elements).
              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->elements).
                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar12) / 0x48) <= uVar16
       ) break;
    if (pEVar12[uVar16].super_Elem.is_finally == false) {
      poVar9 = std::operator<<((ostream *)&std::cout,(string *)&pEVar12[uVar16].super_Elem.name);
      std::operator<<(poVar9,"->");
      uVar18 = 0;
      while( true ) {
        pEVar12 = (pvVar2->
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = *(long *)&pEVar12[uVar16].expression_of_set.
                           super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                           ._M_impl.super__Vector_impl_data;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pEVar12[uVar16].expression_of_set.
                                    super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                    ._M_impl + 8) - lVar20) / 0x18) <= uVar18) break;
        for (uVar19 = 0; lVar10 = *(long *)(lVar20 + uVar18 * 0x18),
            uVar19 < (ulong)(*(long *)(lVar20 + 8 + uVar18 * 0x18) - lVar10 >> 2);
            uVar19 = uVar19 + 1) {
          lVar20 = (long)*(int *)(lVar10 + uVar19 * 4);
          if (lVar20 == -1) {
            std::operator<<((ostream *)&std::cout,"@");
          }
          else {
            std::operator<<((ostream *)&std::cout,(string *)&pEVar12[lVar20].super_Elem.name);
          }
          pEVar12 = (pvVar2->
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar20 = *(long *)&pEVar12[uVar16].expression_of_set.
                             super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                             ._M_impl.super__Vector_impl_data;
        }
        std::operator<<((ostream *)&std::cout," | ");
        uVar18 = uVar18 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    else {
      std::operator+(&t,&finnalyC," ");
      std::operator+(&text,&t,&(pvVar2->
                               super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar16].super_Elem.name);
      std::__cxx11::string::operator=((string *)&finnalyC,(string *)&text);
      std::__cxx11::string::~string((string *)&text);
      std::__cxx11::string::~string((string *)&t);
    }
    uVar16 = uVar16 + 1;
  }
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&finnalyC);
  std::endl<char,std::char_traits<char>>(poVar9);
  get_tow_char_index(this);
  create_first_set(this);
  for (uVar16 = 0;
      uVar16 < (ulong)(((long)(this->elements).
                              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->elements).
                             super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x48); uVar16 = uVar16 + 1
      ) {
    poVar9 = std::operator<<((ostream *)&std::cout,"first[");
    poVar9 = std::operator<<(poVar9,(string *)
                                    &(pvVar2->
                                     super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar16].super_Elem.
                                     name);
    std::operator<<(poVar9,"]={");
    for (uVar18 = 0;
        pvVar7 = (this->first).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar20 = *(long *)&pvVar7[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data,
        uVar18 < (ulong)((long)*(pointer *)
                                ((long)&pvVar7[uVar16].super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar20 >> 2);
        uVar18 = uVar18 + 1) {
      lVar20 = (long)*(int *)(lVar20 + uVar18 * 4);
      poVar9 = (ostream *)&std::cout;
      pcVar17 = "@ ";
      if (lVar20 != -1) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 &(pvVar2->
                                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar20].super_Elem.name
                                );
        pcVar17 = " ";
      }
      std::operator<<(poVar9,pcVar17);
    }
    std::operator<<((ostream *)&std::cout,"}\n");
  }
  this_00 = (this->follow).
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_188,"#",(allocator *)&t);
  text._M_dataplus._M_p._0_4_ = find_name(this,&local_188);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&text);
  std::__cxx11::string::~string((string *)&local_188);
  create_follow_set(this);
  uVar16 = 0;
  while( true ) {
    pEVar12 = (this->elements).
              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->elements).
                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar12) / 0x48) <= uVar16
       ) break;
    if (pEVar12[uVar16].super_Elem.is_finally == false) {
      poVar9 = std::operator<<((ostream *)&std::cout,"follow[");
      poVar9 = std::operator<<(poVar9,(string *)
                                      &(pvVar2->
                                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar16].super_Elem
                                       .name);
      std::operator<<(poVar9,"]={");
      for (uVar18 = 0;
          pvVar7 = (this->follow).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar20 = *(long *)&pvVar7[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data,
          uVar18 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar7[uVar16].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 8) - lVar20 >> 2);
          uVar18 = uVar18 + 1) {
        lVar20 = (long)*(int *)(lVar20 + uVar18 * 4);
        poVar9 = (ostream *)&std::cout;
        pcVar17 = "@ ";
        if (lVar20 != -1) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   (string *)
                                   &(pvVar2->
                                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar20].super_Elem.
                                    name);
          pcVar17 = " ";
        }
        std::operator<<(poVar9,pcVar17);
      }
      std::operator<<((ostream *)&std::cout,"}\n");
    }
    uVar16 = uVar16 + 1;
  }
  create_dfa_states(this);
  uVar16 = 0;
  while( true ) {
    pDVar13 = (this->states).
              super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->states).
                       super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar13) / 0x28) <= uVar16
       ) break;
    uVar18 = 0;
    while( true ) {
      lVar20 = *(long *)&pDVar13[uVar16].projects.
                         super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                         ._M_impl;
      if ((ulong)(((long)*(pointer *)
                          ((long)&pDVar13[uVar16].projects.
                                  super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                                  ._M_impl + 8) - lVar20) / 0xc) <= uVar18) break;
      lVar10 = uVar18 * 0xc;
      iVar8 = *(int *)(lVar20 + lVar10);
      iVar4 = *(int *)(lVar20 + 4 + lVar10);
      iVar5 = *(int *)(lVar20 + 8 + lVar10);
      poVar9 = std::operator<<((ostream *)&std::cout,
                               (string *)
                               &(pvVar2->
                                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                )._M_impl.super__Vector_impl_data._M_start[iVar8].super_Elem.name);
      std::operator<<(poVar9,"->");
      lVar20 = (long)iVar4 * 0x18;
      for (uVar19 = 0;
          lVar10 = *(long *)&(pvVar2->
                             super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                             )._M_impl.super__Vector_impl_data._M_start[iVar8].expression_of_set.
                             super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                             ._M_impl.super__Vector_impl_data,
          uVar19 < (ulong)(*(long *)(lVar10 + 8 + lVar20) - *(long *)(lVar10 + lVar20) >> 2);
          uVar19 = uVar19 + 1) {
        piVar11 = base_grammar::Express::operator[]((Express *)(lVar10 + lVar20),(int)uVar19);
        if (*piVar11 == -1) {
          std::operator<<((ostream *)&std::cout,"@");
        }
        else {
          piVar11 = base_grammar::Express::operator[]
                              ((Express *)
                               (*(long *)&(pvVar2->
                                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                          )._M_impl.super__Vector_impl_data._M_start[iVar8].
                                          expression_of_set.
                                          super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                          ._M_impl.super__Vector_impl_data + lVar20),(int)uVar19);
          std::operator<<((ostream *)&std::cout,
                          (string *)
                          &(pvVar2->
                           super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                           )._M_impl.super__Vector_impl_data._M_start[*piVar11].super_Elem.name);
        }
      }
      poVar9 = std::operator<<((ostream *)&std::cout,"  ProjectPoint:");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
      std::endl<char,std::char_traits<char>>(poVar9);
      uVar18 = uVar18 + 1;
      pDVar13 = (pvVar3->
                super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
    lVar20 = 8;
    for (lVar10 = 0; lVar10 < pDVar13[uVar16].elementCount; lVar10 = lVar10 + 1) {
      if (pDVar13[uVar16].next[lVar10] != -1) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 ((long)&(((pvVar2->
                                           super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->super_Elem).
                                         key + lVar20));
        poVar9 = std::operator<<(poVar9,"--");
        poVar9 = (ostream *)
                 std::ostream::operator<<
                           (poVar9,(pvVar3->
                                   super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar16].next[lVar10]);
        std::operator<<(poVar9,"  ");
        pDVar13 = (pvVar3->
                  super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      }
      lVar20 = lVar20 + 0x48;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar16 = uVar16 + 1;
  }
  create_action_table(this);
  std::__cxx11::string::string((string *)&text,"",(allocator *)&t);
  lVar20 = 8;
  uVar16 = 0;
  while( true ) {
    pEVar12 = (this->elements).
              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->elements).
                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar12) / 0x48) <= uVar16
       ) break;
    sprintf(buffer,"%+7s",*(undefined8 *)((long)&(pEVar12->super_Elem).key + lVar20));
    std::operator+(&t,&text,buffer);
    std::__cxx11::string::operator=((string *)&text,(string *)&t);
    std::__cxx11::string::~string((string *)&t);
    uVar16 = uVar16 + 1;
    lVar20 = lVar20 + 0x48;
  }
  std::operator+(&t,&text,"\n");
  std::__cxx11::string::operator=((string *)&text,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  uVar16 = 0;
  while( true ) {
    pvVar14 = (this->action_table).
              super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->action_table).
                       super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14) / 0x18) <= uVar16
       ) break;
    lVar20 = 0;
    for (uVar18 = 0;
        uVar18 < (ulong)(((long)*(pointer *)
                                 ((long)&pvVar14[uVar16].
                                         super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar14[uVar16].
                                   super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                   ._M_impl.super__Vector_impl_data) / 0xc); uVar18 = uVar18 + 1) {
      t._M_dataplus._M_p = (pointer)&t.field_2;
      t._M_string_length = 0;
      t.field_2._M_local_buf[0] = '\0';
      if (*(uint *)(*(long *)&pvVar14[uVar16].
                              super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                              ._M_impl.super__Vector_impl_data + lVar20) < 4) {
        std::__cxx11::string::assign((char *)&t);
      }
      sprintf(buffer,"%+7s",t._M_dataplus._M_p);
      std::operator+(&local_50,&text,buffer);
      std::__cxx11::string::operator=((string *)&text,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&t);
      pvVar14 = (this->action_table).
                super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0xc;
    }
    std::operator+(&t,&text,"\n");
    std::__cxx11::string::operator=((string *)&text,(string *)&t);
    std::__cxx11::string::~string((string *)&t);
    uVar16 = uVar16 + 1;
  }
  std::operator<<((ostream *)&std::cout,(string *)&text);
  std::__cxx11::string::~string((string *)&text);
  std::__cxx11::string::~string((string *)&finnalyC);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&exp.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result_of_name);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&vectorGenrates);
  return;
}

Assistant:

GrammarLR::GrammarLR(string* generate, int length){

    //1.解析所有字符串
    vector<vector<string>> vectorGenrates;//这个是用来存放各个表达式

    //解析各个表达式,第一个是非终结符号，后面的是产生式
    for (int i = 0; i < length; i++){
        vector<string> temp;
        parse_productions(generate[i], temp);
        vectorGenrates.push_back(temp);
    }



    //2.添加非终结符添加到find表中,开始的非终结符就是length个
    for (int i = 0; i < length; i++){
        add_elem(vectorGenrates[i][0], false);
    }

    //3.一个个解析产生式,会添加到find表中
    vector<string> result_of_name;
    for (int i = 0; i < length; i++){

        //ElemLeft N_F_E = elements[find_name(vectorGenrates[i][0])];//非终结符，接下来要对这个终结符进行exp的添加

        //对genrates[i]进行分析；
        for (int j = 1; j < vectorGenrates[i].size(); j++){
            parse_elem(vectorGenrates[i][j], result_of_name);
            vector<int> exp;
            for (int m = 0; m < result_of_name.size(); m++){
                int index = find_name(result_of_name[m]);
                if (index == -2){
                    index = add_elem(result_of_name[m], true);
                }
                exp.push_back(index);

            }
            elements[find_name(vectorGenrates[i][0])].add_expression(ExpressLR(exp));
        }
    }

    add_elem("#", true);
    //添加拓广文法
    string name = elements[0].name + "'";
    int index = this->add_elem(name, false);
    vector<int> exp;
    exp.push_back(0);
    elements[index].add_expression(exp);

    //查看输入是不正确
    //测试一下：
    string finnalyC = "finnaly:";
    for (int i = 0; i < elements.size(); i++){
        if (!elements[i].is_finally){
            cout << elements[i].name << "->";
            for (int j = 0; j < elements[i].expression_of_set.size(); j++){
                for (int m = 0; m < elements[i].expression_of_set[j].expression.size(); m++){
                    if (elements[i].expression_of_set[j].expression[m] != -1){
                        cout << elements[elements[i].expression_of_set[j].expression[m]].name;
                    }
                    else
                    {
                        cout << "@";
                    }
                }
                cout << " | ";
            }
            cout << endl;
        }
        else
        {
            finnalyC = finnalyC + " " + elements[i].name;
        }
    }
    cout << finnalyC << endl;

    //6.两表生成（在5的时候就不会再添加新的符号了）
    //同时在这里初始化一下First和Follw表
    get_tow_char_index();

    //7.求first集合
    this->create_first_set();

    //检查一下，first集合
    for (int i = 0; i < elements.size(); i++){
        cout << "first[" << elements[i].name << "]={";
        for (int j = 0; j < first[i].size(); j++){
            if (first[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[first[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }

    //8.求follow集合
    //将#送到开始符号
    this->follow[0].push_back(find_name("#"));
    this->create_follow_set();


    for (int i = 0; i < elements.size(); i++){

        if (elements[i].is_finally) continue;

        cout << "follow[" << elements[i].name << "]={";
        for (int j = 0; j < follow[i].size(); j++){
            if (follow[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[follow[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }


    //生成DFA状态表
    this->create_dfa_states();

    //检测DFA
    for (int i = 0; i < this->states.size(); i++){

        for (int j = 0; j < states[i].projects.size(); j++){

            Project tmp = states[i].projects[j];
            cout << elements[tmp.elemKey].name << "->";
            for (int m = 0; m < elements[tmp.elemKey].expression_of_set[tmp.expressIndex].expression.size(); m++){

                if (elements[tmp.elemKey].expression_of_set[tmp.expressIndex][m] != -1){
                    cout << elements[elements[tmp.elemKey].expression_of_set[tmp.expressIndex][m]].name;
                }
                else
                {
                    cout << "@";
                }


            }
            cout << "  ProjectPoint:"<<tmp.projectPoint<<endl;

        }
        for (int j = 0; j < states[i].elementCount; j++){

            if (states[i].next[j] != -1){

                cout << elements[j].name << "--" << states[i].next[j] << "  ";
            }

        }
        cout << endl;

    }

    //创建指导动作的表
    this->create_action_table();

    //将表打印出来
    char formatS[] = "%+7s";//栈的格式
    string text="";
    char buffer[8];
    for (int i = 0; i < elements.size(); i++){
        sprintf(buffer, formatS, elements[i].name.c_str());
        text = text + buffer;
    }
    text = text + "\n";
    for (int i = 0; i < action_table.size(); i++){

        for (int j = 0; j < action_table[i].size(); j++){
            string t;
            switch (action_table[i][j].type)
            {
                case ERROR:
                    t = " ";
                    break;
                case REDUCE:
                    t = "REDUCE";
                    break;
                case SMOVE:
                    t = "SMOVE";
                    break;
                case ACC:
                    t = "ACC";
                    break;
                default:
                    break;
            }
            sprintf(buffer, formatS,t.c_str());
            text = text + buffer;
        }
        text = text + "\n";
    }
    cout << text;
}